

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioScope.cpp
# Opt level: O2

void __thiscall AudioScope::paintEvent(AudioScope *this,QPaintEvent *evt)

{
  size_t sVar1;
  int __type;
  int iVar2;
  int iVar3;
  AudioScope *this_00;
  float ratio;
  QPainter painter;
  float local_98;
  float local_94;
  float local_90;
  float rightSample;
  float leftSample;
  float local_80;
  float local_7c;
  QLineF local_78;
  double local_58;
  Guarded<VisualizerBuffer> *local_50;
  Locked<VisualizerBuffer> handle;
  
  QFrame::paintEvent((QPaintEvent *)this);
  if (this->mBuffer != (Guarded<VisualizerBuffer> *)0x0) {
    Guarded<VisualizerBuffer>::access
              ((Guarded<VisualizerBuffer> *)&handle,(char *)this->mBuffer,__type);
    sVar1 = VisualizerBuffer::size(handle.mRef);
    if (sVar1 == 0) {
      drawSilence(this);
    }
    else {
      iVar3 = *(int *)(*(long *)&this->field_0x20 + 0x1c) -
              *(int *)(*(long *)&this->field_0x20 + 0x14);
      QPainter::QPainter(&painter,(QPaintDevice *)&this->field_0x10);
      QPainter::setRenderHint((RenderHint)&painter,true);
      this_00 = (AudioScope *)&painter;
      QPainter::setPen((QColor *)this_00);
      ratio = (float)(sVar1 & 0xffffffff) / (float)(iVar3 + -1);
      local_90 = 0.0;
      sample(this_00,&handle,0.0,ratio,&local_7c,&local_80);
      local_94 = local_7c;
      local_98 = local_80;
      for (iVar2 = 2; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        local_90 = local_90 + ratio;
        sample(this_00,&handle,local_90,ratio,&leftSample,&rightSample);
        local_78.pt1.xp = (qreal)(iVar2 + -1);
        local_78.pt1.yp = (qreal)local_94;
        local_78.pt2.xp = (qreal)iVar2;
        local_94 = leftSample;
        local_78.pt2.yp = (qreal)leftSample;
        local_58 = local_78.pt2.xp;
        local_50 = (Guarded<VisualizerBuffer> *)local_78.pt1.xp;
        QPainter::drawLine(&painter,&local_78);
        local_78.pt1.yp = (qreal)local_98;
        local_98 = rightSample;
        local_78.pt2.yp = (qreal)rightSample;
        local_78.pt1.xp = (qreal)local_50;
        local_78.pt2.xp = local_58;
        this_00 = (AudioScope *)&painter;
        QPainter::drawLine(&painter,&local_78);
      }
      QPainter::~QPainter(&painter);
    }
    QMutexLocker<QMutex>::unlock(&handle.super_QMutexLocker<QMutex>);
    return;
  }
  drawSilence(this);
  return;
}

Assistant:

void AudioScope::paintEvent(QPaintEvent *evt) {
    QFrame::paintEvent(evt);

    // it may be more efficient to do renderering in a separate thread
    // we can convert a sample buffer to a buffer of QLines, then
    // the paint event just draws the lines

    if (mBuffer == nullptr) {
        // no buffer, draw nothing
        drawSilence();
        return;
    }

    auto handle = mBuffer->access();
    auto size = handle->size();
    if (size == 0) {
        // buffer is empty, draw nothing
        drawSilence();
        return;
    }

    auto const w = width() - (TU::LINE_WIDTH * 2);
    
    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(mLineColor);

    // pixels per sample
    float ratio = (unsigned)size / (float)w;
    float index = 0;

    float prevLeft;
    float prevRight;
    sample(handle, 0.0f, ratio, prevLeft, prevRight);

    int const end = w + TU::LINE_WIDTH;
    for (int t = 1 + TU::LINE_WIDTH; t < end; ++t) {
        index += ratio;
        
        float leftSample;
        float rightSample;
        sample(handle, index, ratio, leftSample, rightSample);

        painter.drawLine(QLineF(t - 1, prevLeft, t, leftSample));
        painter.drawLine(QLineF(t - 1, prevRight, t, rightSample));

        prevLeft = leftSample;
        prevRight = rightSample;

        
    }
    
}